

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut,int flush)

{
  xmlCharEncodingHandler *handler;
  xmlParserErrors xVar1;
  int iVar2;
  xmlChar *out_00;
  bool local_81;
  int local_80;
  int local_7c;
  int c_in;
  int c_out;
  int completeIn;
  int completeOut;
  size_t availOut;
  size_t sStack_60;
  xmlCharEncError ret;
  size_t totalOut;
  size_t totalIn;
  size_t maxOut;
  size_t availIn;
  xmlChar *dataIn;
  xmlBufPtr in;
  xmlBufPtr out;
  size_t *psStack_20;
  int flush_local;
  size_t *sizeOut_local;
  xmlParserInputBufferPtr input_local;
  
  in = input->buffer;
  dataIn = (xmlChar *)input->raw;
  totalIn = *sizeOut;
  sStack_60 = 0;
  *sizeOut = 0;
  out._4_4_ = flush;
  psStack_20 = sizeOut;
  sizeOut_local = (size_t *)input;
  maxOut = xmlBufUse((xmlBufPtr)dataIn);
  if ((maxOut == 0) && (out._4_4_ == 0)) {
    input_local._4_4_ = XML_ENC_ERR_SUCCESS;
  }
  else {
    availIn = (size_t)xmlBufContent((xmlBuf *)dataIn);
    totalOut = 0;
    do {
      _completeIn = xmlBufAvail(in);
      if (0x3fffffff < _completeIn) {
        _completeIn = 0x3fffffff;
      }
      if (totalIn <= _completeIn) {
        local_7c = (int)totalIn;
      }
      else {
        local_7c = (int)_completeIn;
      }
      c_out = (int)(totalIn <= _completeIn);
      if (maxOut < 0x40000000) {
        local_80 = (int)maxOut;
      }
      else {
        local_80 = 0x3fffffff;
      }
      c_in = (int)(maxOut < 0x40000000);
      handler = (xmlCharEncodingHandler *)sizeOut_local[3];
      out_00 = xmlBufEnd(in);
      local_81 = out._4_4_ != 0 && c_in != 0;
      availOut._4_4_ =
           xmlEncInputChunk(handler,out_00,&local_7c,(uchar *)availIn,&local_80,(uint)local_81);
      totalOut = (long)local_80 + totalOut;
      availIn = availIn + (long)local_80;
      maxOut = maxOut - (long)local_80;
      sStack_60 = (long)local_7c + sStack_60;
      totalIn = totalIn - (long)local_7c;
      xmlBufAddLen(in,(long)local_7c);
      if ((availOut._4_4_ != XML_ENC_ERR_SUCCESS) && (availOut._4_4_ != XML_ENC_ERR_SPACE)) {
        xVar1 = xmlEncConvertError(availOut._4_4_);
        *(xmlParserErrors *)((long)sizeOut_local + 0x34) = xVar1;
        return availOut._4_4_;
      }
      if ((((c_out != 0) && (c_in != 0)) || ((c_out != 0 && (availOut._4_4_ == XML_ENC_ERR_SPACE))))
         || ((c_in != 0 && (availOut._4_4_ == XML_ENC_ERR_SUCCESS)))) {
        xmlBufShrink((xmlBufPtr)dataIn,totalOut);
        if (-totalOut - 1 < sizeOut_local[7]) {
          sizeOut_local[7] = 0xffffffffffffffff;
        }
        else {
          sizeOut_local[7] = totalOut + sizeOut_local[7];
        }
        *psStack_20 = sStack_60;
        return XML_ENC_ERR_SUCCESS;
      }
    } while ((availOut._4_4_ != XML_ENC_ERR_SPACE) || (iVar2 = xmlBufGrow(in,0x1000), -1 < iVar2));
    *(undefined4 *)((long)sizeOut_local + 0x34) = 2;
    input_local._4_4_ = XML_ENC_ERR_MEMORY;
  }
  return input_local._4_4_;
}

Assistant:

xmlCharEncError
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut, int flush)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    xmlCharEncError ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if ((availIn == 0) && (!flush))
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in, flush && completeIn);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ENC_ERR_SUCCESS);
}